

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  ContextType CVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar9;
  long lVar3;
  long lVar4;
  long *plVar5;
  ulong *puVar6;
  undefined1 *puVar7;
  TestError *pTVar8;
  long *plVar10;
  size_type *psVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  long lVar15;
  undefined1 *puVar16;
  string *psVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  undefined4 local_2d4;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string invalid_size_declarations [15];
  
  invalid_size_declarations[0]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0].field_2;
  local_300 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)invalid_size_declarations,"[0][0][0][y]","");
  invalid_size_declarations[1]._M_dataplus._M_p = (pointer)&invalid_size_declarations[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 1),"[0][0][y][0]","");
  invalid_size_declarations[2]._M_dataplus._M_p = (pointer)&invalid_size_declarations[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 2),"[0][y][0][0]","");
  invalid_size_declarations[3]._M_dataplus._M_p = (pointer)&invalid_size_declarations[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 3),"[y][0][0][0]","");
  invalid_size_declarations[4]._M_dataplus._M_p = (pointer)&invalid_size_declarations[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 4),"[0][0][y][y]","");
  invalid_size_declarations[5]._M_dataplus._M_p = (pointer)&invalid_size_declarations[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 5),"[0][y][0][y]","");
  invalid_size_declarations[6]._M_dataplus._M_p = (pointer)&invalid_size_declarations[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 6),"[y][0][0][y]","");
  invalid_size_declarations[7]._M_dataplus._M_p = (pointer)&invalid_size_declarations[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 7),"[0][y][y][0]","");
  invalid_size_declarations[8]._M_dataplus._M_p = (pointer)&invalid_size_declarations[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 8),"[y][0][y][0]","");
  invalid_size_declarations[9]._M_dataplus._M_p = (pointer)&invalid_size_declarations[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 9),"[y][y][0][0]","");
  invalid_size_declarations[10]._M_dataplus._M_p = (pointer)&invalid_size_declarations[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 10),"[0][y][y][y]","");
  invalid_size_declarations[0xb]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xb].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xb),"[y][0][y][y]","");
  invalid_size_declarations[0xc]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xc].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xc),"[y][y][0][y]","");
  invalid_size_declarations[0xd]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xd].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xd),"[y][y][y][0]","");
  paVar18 = &invalid_size_declarations[0xe].field_2;
  invalid_size_declarations[0xe]._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xe),"[y][y][y][y]","");
  CVar2.super_ApiType.m_bits =
       (ApiType)(*((local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)
                  ->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  uVar9 = extraout_var;
  if (!bVar1) {
    CVar2.super_ApiType.m_bits =
         (ApiType)(*((local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                    context_id)->m_renderCtx->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(CVar2,(ApiType)0x104);
    uVar9 = extraout_var_00;
    if ((!bVar1) &&
       (bVar1 = glu::ContextInfo::isExtensionSupported
                          (((local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                           context_id)->m_contextInfo,"GL_EXT_gpu_shader5"), uVar9 = extraout_var_01
       , !bVar1)) {
      local_2d4 = 0;
      goto LAB_00b60fea;
    }
  }
  local_2d4 = (undefined4)CONCAT71(uVar9,1);
LAB_00b60fea:
  lVar15 = 0;
  do {
    lVar3 = 0x222cb38;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar3 = 0x222cb38;
      lVar4 = supported_variable_types_map._16_8_;
      do {
        if ((int)(&opaque_var_types)[lVar15] <= *(int *)(lVar4 + 0x20)) {
          lVar3 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 +
                         (ulong)(*(int *)(lVar4 + 0x20) < (int)(&opaque_var_types)[lVar15]) * 8);
      } while (lVar4 != 0);
    }
    lVar4 = 0x222cb38;
    if ((lVar3 != 0x222cb38) &&
       (lVar4 = lVar3, (int)(&opaque_var_types)[lVar15] < *(int *)(lVar3 + 0x20))) {
      lVar4 = 0x222cb38;
    }
    if (lVar4 == 0x222cb38) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xd63);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar3 = 8;
    do {
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&shader_source,"int y = 1;\n","");
      std::operator+(&local_2b0,"uniform ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar4 + 0x48));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_320 = &local_310;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_310 = *plVar10;
        lStack_308 = plVar5[3];
      }
      else {
        local_310 = *plVar10;
        local_320 = (long *)*plVar5;
      }
      local_318 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_320,*(ulong *)(lVar4 + 0x28));
      local_2f8 = &local_2e8;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_2e8 = *plVar10;
        lStack_2e0 = plVar5[3];
      }
      else {
        local_2e8 = *plVar10;
        local_2f8 = (long *)*plVar5;
      }
      local_2f0 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_2c0 = *plVar10;
        lStack_2b8 = plVar5[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0 = *plVar10;
        local_2d0 = (long *)*plVar5;
      }
      local_2c8 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_2d0);
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_320 != &local_310) {
        operator_delete(local_320,local_310 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::append((char *)&shader_source);
      std::operator+(&local_238,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar4 + 0x168));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_290 = &local_280;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_280 = *plVar10;
        lStack_278 = plVar5[3];
      }
      else {
        local_280 = *plVar10;
        local_290 = (long *)*plVar5;
      }
      local_288 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_290,
                                  *(ulong *)((long)invalid_size_declarations + lVar3 + -8));
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      psVar11 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_320 = &local_310;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_310 = *plVar10;
        lStack_308 = plVar5[3];
      }
      else {
        local_310 = *plVar10;
        local_320 = (long *)*plVar5;
      }
      local_318 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_320,*(ulong *)(lVar4 + 0x148))
      ;
      local_2f8 = &local_2e8;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_2e8 = *plVar10;
        lStack_2e0 = plVar5[3];
      }
      else {
        local_2e8 = *plVar10;
        local_2f8 = (long *)*plVar5;
      }
      local_2f0 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_2c0 = *plVar10;
        lStack_2b8 = plVar5[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0 = *plVar10;
        local_2d0 = (long *)*plVar5;
      }
      local_2c8 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_2d0);
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_320 != &local_310) {
        operator_delete(local_320,local_310 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd55);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      puVar6 = &set_tesseation_abi_cxx11_;
      switch(tested_shader_type) {
      case VERTEX_SHADER_TYPE:
        std::__cxx11::string::append((char *)&shader_source);
        break;
      case GEOMETRY_SHADER_TYPE:
        puVar6 = &emit_quad_abi_cxx11_;
      case TESSELATION_CONTROL_SHADER_TYPE:
        std::__cxx11::string::_M_append((char *)&shader_source,*puVar6);
      }
      std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
      if ((char)local_2d4 == '\0') {
        (*(local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[8])(local_300,(ulong)tested_shader_type,&shader_source);
        goto LAB_00b61692;
      }
      puVar14 = empty_string_abi_cxx11_;
      puVar13 = empty_string_abi_cxx11_;
      puVar12 = empty_string_abi_cxx11_;
      puVar16 = empty_string_abi_cxx11_;
      puVar7 = (undefined1 *)&shader_source;
      psVar17 = (string *)empty_string_abi_cxx11_;
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        puVar7 = empty_string_abi_cxx11_;
        puVar14 = default_vertex_shader_source_abi_cxx11_;
        puVar13 = default_tc_shader_source_abi_cxx11_;
        puVar12 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
        puVar16 = default_geometry_shader_source_abi_cxx11_;
        psVar17 = &shader_source;
        break;
      case VERTEX_SHADER_TYPE:
        puVar13 = default_tc_shader_source_abi_cxx11_;
        puVar14 = (undefined1 *)&shader_source;
        goto LAB_00b61628;
      case COMPUTE_SHADER_TYPE:
        break;
      case GEOMETRY_SHADER_TYPE:
        puVar14 = default_vertex_shader_source_abi_cxx11_;
        puVar13 = default_tc_shader_source_abi_cxx11_;
        puVar12 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
        puVar16 = (undefined1 *)&shader_source;
        goto LAB_00b61669;
      case TESSELATION_CONTROL_SHADER_TYPE:
        puVar13 = (undefined1 *)&shader_source;
        puVar14 = default_vertex_shader_source_abi_cxx11_;
LAB_00b61628:
        puVar12 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b61662:
        puVar16 = default_geometry_shader_source_abi_cxx11_;
LAB_00b61669:
        puVar7 = empty_string_abi_cxx11_;
        psVar17 = (string *)default_fragment_shader_source_abi_cxx11_;
        break;
      case TESSELATION_EVALUATION_SHADER_TYPE:
        puVar14 = default_vertex_shader_source_abi_cxx11_;
        puVar13 = default_tc_shader_source_abi_cxx11_;
        puVar12 = (undefined1 *)&shader_source;
        goto LAB_00b61662;
      default:
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd59);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*(local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[10])
                (local_300,puVar14,puVar13,puVar12,puVar16,psVar17,puVar7,1,1);
LAB_00b61692:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        shader_source.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x1e8);
    lVar15 = lVar15 + 1;
    if (lVar15 == 0xf) {
      lVar15 = -0x1e0;
      do {
        plVar5 = (long *)(((string *)(paVar18 + -1))->_M_dataplus)._M_p;
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar5) {
          operator_delete(plVar5,paVar18->_M_allocated_capacity + 1);
        }
        paVar18 = paVar18 + -2;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsDynamicIndexing2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int				  num_var_types				  = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);
	const std::string invalid_size_declarations[] = { "[0][0][0][y]", "[0][0][y][0]", "[0][y][0][0]", "[y][0][0][0]",
													  "[0][0][y][y]", "[0][y][0][y]", "[y][0][0][y]", "[0][y][y][0]",
													  "[y][0][y][0]", "[y][y][0][0]", "[0][y][y][y]", "[y][0][y][y]",
													  "[y][y][0][y]", "[y][y][y][0]", "[y][y][y][y]" };

	bool dynamic_indexing_supported = false;
	if (glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::es(3, 2)) ||
		glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::core(4, 0)) ||
		this->context_id.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
	{
		dynamic_indexing_supported = true;
	}

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			int num_invalid_size_declarations =
				sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);

			for (int invalid_size_index = 0; invalid_size_index < num_invalid_size_declarations; invalid_size_index++)
			{
				std::string shader_source = "int y = 1;\n";

				shader_source += "uniform " + var_iterator->second.precision + " " + var_iterator->second.type +
								 " x[2][2][2][2];\n\n";
				shader_source += "void main()\n";
				shader_source += "{\n";
				shader_source += ("    " + var_iterator->second.type_of_result_of_texture_function +
								  " color = texture(x" + invalid_size_declarations[invalid_size_index] + ", " +
								  var_iterator->second.coord_param_for_texture_function + ");\n");

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				if (dynamic_indexing_supported)
				{
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, true);
				}
				else
				{
					this->execute_negative_test(tested_shader_type, shader_source);
				}
			} /* for (int invalid_size_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}